

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.h
# Opt level: O0

void __thiscall
jrtplib::RTPFakeTransmissionInfo::~RTPFakeTransmissionInfo(RTPFakeTransmissionInfo *this)

{
  RTPFakeTransmissionInfo *this_local;
  
  ~RTPFakeTransmissionInfo(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

~RTPFakeTransmissionInfo()								{ }